

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O3

void __thiscall
duckdb::WindowValueLocalState::Sink
          (WindowValueLocalState *this,WindowExecutorGlobalState *gstate,DataChunk *sink_chunk,
          DataChunk *coll_chunk,idx_t input_idx)

{
  idx_t count;
  sel_t *psVar1;
  sel_t *psVar2;
  reference this_00;
  WindowMergeSortTreeLocalState *this_01;
  optional_ptr<duckdb::SelectionVector,_true> filter_sel;
  ulong uVar3;
  ulong uVar4;
  idx_t filtered;
  UnifiedVectorFormat child_data;
  UnifiedVectorFormat local_78;
  
  if ((this->local_value).
      super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
      .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl !=
      (WindowAggregatorState *)0x0) {
    count = coll_chunk->count;
    this_00 = vector<duckdb::Vector,_true>::operator[](&coll_chunk->data,this->gvstate->child_idx);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(this_00,count,&local_78);
    filter_sel.ptr = (SelectionVector *)0x0;
    filtered = 0;
    if (gstate->executor->wexpr->ignore_nulls == true) {
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        filter_sel.ptr = (SelectionVector *)0x0;
        filtered = 0;
      }
      else {
        if (count == 0) {
          filtered = 0;
        }
        else {
          psVar1 = (local_78.sel)->sel_vector;
          psVar2 = (this->sort_nulls).sel_vector;
          uVar3 = 0;
          filtered = 0;
          do {
            uVar4 = uVar3;
            if (psVar1 != (sel_t *)0x0) {
              uVar4 = (ulong)psVar1[uVar3];
            }
            if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0) {
              psVar2[filtered] = (sel_t)uVar3;
              filtered = filtered + 1;
            }
            uVar3 = uVar3 + 1;
          } while ((uVar3 & 0xffffffff) < count);
        }
        filter_sel.ptr = &this->sort_nulls;
      }
    }
    this_01 = (WindowMergeSortTreeLocalState *)
              unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
              ::operator->(&this->local_value);
    WindowMergeSortTreeLocalState::SinkChunk(this_01,sink_chunk,input_idx,filter_sel,filtered);
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

WindowFirstValueExecutor::WindowFirstValueExecutor(BoundWindowExpression &wexpr, ClientContext &context,
                                                   WindowSharedExpressions &shared)
    : WindowValueExecutor(wexpr, context, shared) {
}